

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Server_processSecureChannelMessage
               (UA_Server *server,UA_SecureChannel *channel,UA_MessageType messagetype,
               UA_UInt32 requestId,UA_ByteString *message)

{
  uint uVar1;
  UA_Logger logger;
  char *pcVar2;
  uint local_9c;
  uint local_8c;
  uint local_7c;
  uint local_6c;
  uint local_5c;
  uint local_44;
  UA_TcpErrorMessage *msg;
  UA_ByteString *message_local;
  UA_UInt32 requestId_local;
  UA_MessageType messagetype_local;
  UA_SecureChannel *channel_local;
  UA_Server *server_local;
  
  if (channel == (UA_SecureChannel *)0x0) {
    __assert_fail("channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x442a,
                  "void UA_Server_processSecureChannelMessage(UA_Server *, UA_SecureChannel *, UA_MessageType, UA_UInt32, const UA_ByteString *)"
                 );
  }
  if (channel->connection != (UA_Connection *)0x0) {
    if (messagetype == UA_MESSAGETYPE_MSG) {
      if (channel->connection == (UA_Connection *)0x0) {
        local_7c = 0;
      }
      else {
        local_7c = channel->connection->sockfd;
      }
      UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Process a MSG",(ulong)local_7c,
                   (ulong)(channel->securityToken).channelId,
                   (ulong)(uint)channel->connection->sockfd);
      processMSG(server,channel,requestId,message);
    }
    else if (messagetype == UA_MESSAGETYPE_HEL) {
      if (channel->connection == (UA_Connection *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = channel->connection->sockfd;
      }
      UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Cannot process a HEL on an open channel",
                   (ulong)local_5c,(ulong)(channel->securityToken).channelId);
    }
    else if (messagetype == UA_MESSAGETYPE_OPN) {
      if (channel->connection == (UA_Connection *)0x0) {
        local_6c = 0;
      }
      else {
        local_6c = channel->connection->sockfd;
      }
      UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Process an OPN on an open channel",
                   (ulong)local_6c,(ulong)(channel->securityToken).channelId);
      processOPN(server,channel->connection,(channel->securityToken).channelId,message);
    }
    else if (messagetype == UA_MESSAGETYPE_CLO) {
      if (channel->connection == (UA_Connection *)0x0) {
        local_8c = 0;
      }
      else {
        local_8c = channel->connection->sockfd;
      }
      UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Process a CLO",(ulong)local_8c,
                   (ulong)(channel->securityToken).channelId,
                   (ulong)(uint)channel->connection->sockfd);
      Service_CloseSecureChannel(server,channel);
    }
    else if (messagetype == UA_MESSAGETYPE_ERR) {
      logger = (server->config).logger;
      if (channel->connection == (UA_Connection *)0x0) {
        local_44 = 0;
      }
      else {
        local_44 = channel->connection->sockfd;
      }
      uVar1 = (channel->securityToken).channelId;
      pcVar2 = UA_StatusCode_name((UA_StatusCode)message->length);
      UA_LOG_ERROR(logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Client replied with an error message: %s %.*s"
                   ,(ulong)local_44,(ulong)uVar1,pcVar2,message->data,message[1].length);
    }
    else {
      if (channel->connection == (UA_Connection *)0x0) {
        local_9c = 0;
      }
      else {
        local_9c = channel->connection->sockfd;
      }
      UA_LOG_TRACE((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                   "Connection %i | SecureChannel %i | Unknown message type",(ulong)local_9c,
                   (ulong)(channel->securityToken).channelId);
    }
    return;
  }
  __assert_fail("channel->connection",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                ,0x442b,
                "void UA_Server_processSecureChannelMessage(UA_Server *, UA_SecureChannel *, UA_MessageType, UA_UInt32, const UA_ByteString *)"
               );
}

Assistant:

static void
UA_Server_processSecureChannelMessage(UA_Server *server, UA_SecureChannel *channel,
                                      UA_MessageType messagetype, UA_UInt32 requestId,
                                      const UA_ByteString *message) {
    UA_assert(channel);
    UA_assert(channel->connection);
    switch(messagetype) {
    case UA_MESSAGETYPE_ERR: {
        const UA_TcpErrorMessage *msg = (const UA_TcpErrorMessage *) message;
        UA_LOG_ERROR_CHANNEL(server->config.logger, channel,
                             "Client replied with an error message: %s %.*s",
                             UA_StatusCode_name(msg->error), msg->reason.length, msg->reason.data);
        break;
    }
    case UA_MESSAGETYPE_HEL:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Cannot process a HEL on an open channel");
        break;
    case UA_MESSAGETYPE_OPN:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process an OPN on an open channel");
        processOPN(server, channel->connection, channel->securityToken.channelId, message);
        break;
    case UA_MESSAGETYPE_MSG:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process a MSG", channel->connection->sockfd);
        processMSG(server, channel, requestId, message);
        break;
    case UA_MESSAGETYPE_CLO:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Process a CLO", channel->connection->sockfd);
        Service_CloseSecureChannel(server, channel);
        break;
    default:
        UA_LOG_TRACE_CHANNEL(server->config.logger, channel,
                             "Unknown message type");
    }
}